

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void __thiscall
duckdb::ModeFunction<duckdb::ModeStandard<int>_>::
UpdateWindowState<duckdb::ModeState<int,_duckdb::ModeStandard<int>_>,_int>::Left
          (UpdateWindowState<duckdb::ModeState<int,_duckdb::ModeStandard<int>_>,_int> *this,
          idx_t begin,idx_t end)

{
  bool bVar1;
  idx_t local_20;
  
  while (begin < end) {
    local_20 = begin;
    bVar1 = ModeIncluded<duckdb::ModeState<int,_duckdb::ModeStandard<int>_>_>::operator()
                      (this->included,&local_20);
    if (bVar1) {
      ModeState<int,_duckdb::ModeStandard<int>_>::ModeRm(this->state,local_20);
    }
    begin = local_20 + 1;
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					state.ModeRm(begin);
				}
			}
		}